

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O1

_Bool rsa_ssh1_decrypt_pkcs1(mp_int *input,RSAKey *key,strbuf *outbuf)

{
  uint8_t val;
  uchar uVar1;
  strbuf *buf_o;
  mp_int *x;
  size_t sVar2;
  int iVar3;
  _Bool _Var4;
  ulong byte;
  BinarySource src [1];
  BinarySource local_58;
  
  buf_o = strbuf_new_nm();
  x = rsa_privkey_op(input,key);
  sVar2 = mp_get_nbits(key->modulus);
  if (7 < sVar2 + 7) {
    byte = sVar2 + 7 >> 3;
    do {
      byte = byte - 1;
      val = mp_get_byte(x,byte);
      BinarySink_put_byte(buf_o->binarysink_,val);
    } while (byte != 0);
  }
  mp_free(x);
  local_58.data = buf_o->u;
  local_58.len = buf_o->len;
  local_58.pos = 0;
  local_58.err = BSE_NO_ERROR;
  local_58.binarysource_ = &local_58;
  uVar1 = BinarySource_get_byte(&local_58);
  if ((uVar1 == '\0') && (uVar1 = BinarySource_get_byte(local_58.binarysource_), uVar1 == '\x02')) {
    do {
      uVar1 = BinarySource_get_byte(local_58.binarysource_);
      iVar3 = 6;
      if (uVar1 != '\0') {
        iVar3 = 0;
      }
      if ((local_58.binarysource_)->err != BSE_NO_ERROR) {
        iVar3 = 4;
      }
    } while (iVar3 == 0);
    if (iVar3 == 2) {
      return false;
    }
    if (iVar3 != 4) {
      BinarySink_put_data(outbuf->binarysink_,
                          (void *)((long)(local_58.binarysource_)->data +
                                  (local_58.binarysource_)->pos),
                          (local_58.binarysource_)->len - (local_58.binarysource_)->pos);
      _Var4 = true;
      goto LAB_001615c8;
    }
  }
  _Var4 = false;
LAB_001615c8:
  strbuf_free(buf_o);
  return _Var4;
}

Assistant:

bool rsa_ssh1_decrypt_pkcs1(mp_int *input, RSAKey *key,
                            strbuf *outbuf)
{
    strbuf *data = strbuf_new_nm();
    bool success = false;
    BinarySource src[1];

    {
        mp_int *b = rsa_ssh1_decrypt(input, key);
        for (size_t i = (mp_get_nbits(key->modulus) + 7) / 8; i-- > 0 ;) {
            put_byte(data, mp_get_byte(b, i));
        }
        mp_free(b);
    }

    BinarySource_BARE_INIT(src, data->u, data->len);

    /* Check PKCS#1 formatting prefix */
    if (get_byte(src) != 0) goto out;
    if (get_byte(src) != 2) goto out;
    while (1) {
        unsigned char byte = get_byte(src);
        if (get_err(src)) goto out;
        if (byte == 0)
            break;
    }

    /* Everything else is the payload */
    success = true;
    put_data(outbuf, get_ptr(src), get_avail(src));

  out:
    strbuf_free(data);
    return success;
}